

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O3

void __thiscall
license::EventRegistry::addEvent
          (EventRegistry *this,EVENT_TYPE event,SEVERITY severity,string *eventParameter)

{
  pointer *ppAVar1;
  iterator __position;
  AuditEvent audit;
  AuditEvent local_218;
  
  local_218.severity = severity;
  local_218.event_type = event;
  strncpy(local_218.param1,(eventParameter->_M_dataplus)._M_p,0xff);
  local_218.param2[0] = '\0';
  __position._M_current =
       (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<AuditEvent,std::allocator<AuditEvent>>::_M_realloc_insert<AuditEvent_const&>
              ((vector<AuditEvent,std::allocator<AuditEvent>> *)this,__position,&local_218);
  }
  else {
    memcpy(__position._M_current,&local_218,0x208);
    ppAVar1 = &(this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
  return;
}

Assistant:

void EventRegistry::addEvent(EVENT_TYPE event, SEVERITY severity,
		const string& eventParameter) {
	AuditEvent audit;
	audit.severity = severity;
	audit.event_type = event;
	strncpy(audit.param1, eventParameter.c_str(), 255);
	audit.param2[0] = '\0';
	logs.push_back(audit);
}